

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<vector_malloc<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_malloc<unsigned_char_*,_16U> *buckets)

{
  vector_malloc<unsigned_char_*,_16U> *pvVar1;
  undefined8 *puVar2;
  ushort uVar3;
  uchar *puVar4;
  int iVar5;
  uint j;
  long lVar6;
  size_t sVar7;
  uchar *puVar8;
  size_t *psVar9;
  uchar **ppuVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  uint j_1;
  ulong n_00;
  uint i;
  long lVar14;
  uchar **ppuVar15;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar10 = strings;
      do {
        puVar8 = ppuVar10[1];
        ppuVar10 = ppuVar10 + 1;
        for (ppuVar15 = ppuVar10; strings < ppuVar15; ppuVar15 = ppuVar15 + -1) {
          puVar4 = ppuVar15[-1];
          bVar12 = puVar4[depth];
          bVar13 = puVar8[depth];
          if ((bVar12 != 0) && (lVar6 = depth + 1, bVar12 == bVar13)) {
            do {
              bVar12 = puVar4[lVar6];
              bVar13 = puVar8[lVar6];
              if (bVar12 == 0) break;
              lVar6 = lVar6 + 1;
            } while (bVar12 == bVar13);
          }
          if (bVar12 <= bVar13) break;
          *ppuVar15 = puVar4;
        }
        iVar5 = (int)n;
        *ppuVar15 = puVar8;
        n = (size_t)(iVar5 - 1);
      } while (2 < iVar5);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      ppuVar10 = strings;
      do {
        lVar6 = 0;
        do {
          *(uchar *)((long)local_238 + lVar6) = ppuVar10[lVar6][depth];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        lVar6 = 0;
        do {
          pvVar1 = buckets + *(byte *)((long)local_238 + lVar6);
          sVar7 = pvVar1->_size;
          if (sVar7 == pvVar1->_capacity) {
            vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
            sVar7 = pvVar1->_size;
          }
          pvVar1->_data[sVar7] = ppuVar10[lVar6];
          pvVar1->_size = sVar7 + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        uVar11 = uVar11 + 0x20;
        ppuVar10 = ppuVar10 + 0x20;
      } while (uVar11 < (n & 0xffffffffffffffe0));
    }
    if (uVar11 < n) {
      do {
        puVar8 = strings[uVar11];
        pvVar1 = buckets + puVar8[depth];
        sVar7 = pvVar1->_size;
        if (sVar7 == pvVar1->_capacity) {
          vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
          sVar7 = pvVar1->_size;
          puVar8 = strings[uVar11];
        }
        pvVar1->_data[sVar7] = puVar8;
        pvVar1->_size = sVar7 + 1;
        uVar11 = uVar11 + 1;
      } while (n != uVar11);
    }
    psVar9 = &buckets->_size;
    lVar6 = 0;
    do {
      local_238[lVar6] = (ushort)*psVar9;
      lVar6 = lVar6 + 1;
      psVar9 = psVar9 + 3;
    } while (lVar6 != 0x100);
    psVar9 = &buckets->_size;
    lVar6 = 0;
    lVar14 = 0;
    do {
      uVar3 = local_238[lVar6];
      if ((ulong)uVar3 != 0) {
        if (*psVar9 != 0) {
          memmove(strings + lVar14,((vector_malloc<unsigned_char_*,_16U> *)(psVar9 + -1))->_data,
                  *psVar9 << 3);
        }
        lVar14 = lVar14 + (ulong)uVar3;
      }
      lVar6 = lVar6 + 1;
      psVar9 = psVar9 + 3;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    do {
      free(*(void **)((long)&buckets->_data + lVar6));
      puVar2 = (undefined8 *)((long)&buckets->_data + lVar6);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)&buckets->_capacity + lVar6) = 0;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x1800);
    uVar11 = (ulong)local_238[0];
    lVar6 = 1;
    do {
      n_00 = (ulong)local_238[lVar6];
      if (n_00 != 0) {
        msd_D<vector_malloc<unsigned_char*,16u>,unsigned_short>
                  (strings + uVar11,n_00,depth + 1,buckets);
        uVar11 = uVar11 + n_00;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}